

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O0

ostream * operator<<(ostream *os,vector<int,_std::allocator<int>_> *v)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_1c;
  int i;
  vector<int,_std::allocator<int>_> *v_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(v);
    if (sVar1 <= (ulong)(long)local_1c) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](v,(long)local_1c);
    std::ostream::operator<<((ostream *)os,*pvVar2);
    sVar1 = std::vector<int,_std::allocator<int>_>::size(v);
    if ((long)local_1c != sVar1 - 1) {
      std::operator<<(os,", ");
    }
    local_1c = local_1c + 1;
  }
  std::operator<<(os,"]\n");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const vector<T>& v) 
{ 
    os << "["; 
    for (int i = 0; i < v.size(); ++i) { 
        os << v[i]; 
        if (i != v.size() - 1) 
            os << ", "; 
    } 
    os << "]\n"; 
    return os; 
}